

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lys_print_(lyout *out,lys_module *module,LYS_OUTFORMAT format,char *target_node)

{
  LY_ERR *pLVar1;
  int local_30;
  int local_2c;
  int grps;
  int ret;
  char *target_node_local;
  LYS_OUTFORMAT format_local;
  lys_module *module_local;
  lyout *out_local;
  
  local_30 = 0;
  switch(format) {
  case LYS_OUT_YANG:
    lys_switch_deviations(module);
    local_2c = yang_print_model(out,module);
    lys_switch_deviations(module);
    break;
  case LYS_OUT_YIN:
    lys_switch_deviations(module);
    local_2c = yin_print_model(out,module);
    lys_switch_deviations(module);
    break;
  case LYS_OUT_TREE_GRPS:
    local_30 = 1;
  case LYS_OUT_TREE:
    local_2c = tree_print_model(out,module,local_30);
    break;
  case LYS_OUT_INFO:
    local_2c = info_print_model(out,module,target_node);
    break;
  default:
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    ly_log(LY_LLERR,"Unknown output format.");
    local_2c = 1;
  }
  return local_2c;
}

Assistant:

static int
lys_print_(struct lyout *out, const struct lys_module *module, LYS_OUTFORMAT format, const char *target_node)
{
    int ret;
    int grps = 0;

    switch (format) {
    case LYS_OUT_YIN:
        lys_switch_deviations((struct lys_module *)module);
        ret = yin_print_model(out, module);
        lys_switch_deviations((struct lys_module *)module);
        break;
    case LYS_OUT_YANG:
        lys_switch_deviations((struct lys_module *)module);
        ret = yang_print_model(out, module);
        lys_switch_deviations((struct lys_module *)module);
        break;
    case LYS_OUT_TREE_GRPS:
        grps = 1;
        /* no break */
    case LYS_OUT_TREE:
        ret = tree_print_model(out, module, grps);
        break;
    case LYS_OUT_INFO:
        ret = info_print_model(out, module, target_node);
        break;
    default:
        LOGERR(LY_EINVAL, "Unknown output format.");
        ret = EXIT_FAILURE;
        break;
    }

    return ret;
}